

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParseException.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::SAXParseException::SAXParseException
          (SAXParseException *this,XMLCh *message,Locator *locator,MemoryManager *manager)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar2;
  undefined4 extraout_var_02;
  MemoryManager *manager_local;
  Locator *locator_local;
  XMLCh *message_local;
  SAXParseException *this_local;
  
  SAXException::SAXException(&this->super_SAXException,message,manager);
  (this->super_SAXException)._vptr_SAXException = (_func_int **)&PTR__SAXParseException_005334d0;
  iVar1 = (*locator->_vptr_Locator[5])();
  this->fColumnNumber = CONCAT44(extraout_var,iVar1);
  iVar1 = (*locator->_vptr_Locator[4])();
  this->fLineNumber = CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*locator->_vptr_Locator[2])();
  pXVar2 = XMLString::replicate((XMLCh *)CONCAT44(extraout_var_01,iVar1),manager);
  this->fPublicId = pXVar2;
  iVar1 = (*locator->_vptr_Locator[3])();
  pXVar2 = XMLString::replicate((XMLCh *)CONCAT44(extraout_var_02,iVar1),manager);
  this->fSystemId = pXVar2;
  return;
}

Assistant:

SAXParseException::SAXParseException(const  XMLCh* const    message
                                    , const Locator&        locator
                                    , MemoryManager* const  manager) :
    SAXException(message, manager)
    , fColumnNumber(locator.getColumnNumber())
    , fLineNumber(locator.getLineNumber())
    , fPublicId(XMLString::replicate(locator.getPublicId(), manager))
    , fSystemId(XMLString::replicate(locator.getSystemId(), manager))
{
}